

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O1

void __thiscall
QDtlsClientVerifierPrivate::QDtlsClientVerifierPrivate(QDtlsClientVerifierPrivate *this)

{
  DtlsCookieVerifier *pDVar1;
  QDebug QVar2;
  QTlsBackend *pQVar3;
  DtlsCookieVerifier *pDVar4;
  QLoggingCategory *pQVar5;
  QDtlsClientVerifierPrivate *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QArrayData *local_78;
  undefined8 *local_70;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QDtlsClientVerifierPrivate_002d6398;
  (this->backend)._M_t.
  super___uniq_ptr_impl<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
  .super__Head_base<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_false>._M_head_impl =
       (DtlsCookieVerifier *)0x0;
  pQVar3 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar3 == (QTlsBackend *)0x0) {
    this_00 = (QDtlsClientVerifierPrivate *)QtPrivateLogging::lcSsl();
    if ((this_00->field_0x11 & 1) != 0) {
      QDtlsClientVerifierPrivate(this_00);
    }
  }
  else {
    pDVar4 = (DtlsCookieVerifier *)(**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3);
    pDVar1 = (this->backend)._M_t.
             super___uniq_ptr_impl<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
             .super__Head_base<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_false>._M_head_impl;
    (this->backend)._M_t.
    super___uniq_ptr_impl<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
    ._M_t.
    super__Tuple_impl<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
    .super__Head_base<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_false>._M_head_impl = pDVar4;
    if (pDVar1 != (DtlsCookieVerifier *)0x0) {
      (**(code **)(*(long *)pDVar1 + 8))();
    }
    if ((this->backend)._M_t.
        super___uniq_ptr_impl<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
        ._M_t.
        super__Tuple_impl<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
        .super__Head_base<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_false>._M_head_impl ==
        (DtlsCookieVerifier *)0x0) {
      pQVar5 = QtPrivateLogging::lcSsl();
      if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_48 = pQVar5->name;
        local_60 = 2;
        local_5c = 0;
        uStack_54 = 0;
        local_4c = 0;
        QMessageLogger::warning();
        QVar2.stream = local_40.stream;
        QVar6.m_data = (storage_type *)0xb;
        QVar6.m_size = (qsizetype)local_38;
        QString::fromUtf8(QVar6);
        QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_38);
        if (local_38[0] != (QArrayData *)0x0) {
          LOCK();
          (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_38[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_40.stream,' ');
        }
        (**(code **)(*(long *)pQVar3 + 0x90))(&local_78,pQVar3);
        if (local_70 == (undefined8 *)0x0) {
          local_70 = &QString::_empty;
        }
        QDebug::putString((QChar *)&local_40,(ulong)local_70);
        if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_40.stream,' ');
        }
        QVar2.stream = local_40.stream;
        QVar7.m_data = (storage_type *)0x1d;
        QVar7.m_size = (qsizetype)local_38;
        QString::fromUtf8(QVar7);
        QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_38);
        if (local_38[0] != (QArrayData *)0x0) {
          LOCK();
          (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_38[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_40.stream,' ');
        }
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
          }
        }
        QDebug::~QDebug(&local_40);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDtlsClientVerifierPrivate::QDtlsClientVerifierPrivate()
{
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available, cannot verify DTLS client");
        return;
    }
    backend.reset(tlsBackend->createDtlsCookieVerifier());
    if (!backend.get())
        qCWarning(lcSsl) << "The backend" << tlsBackend->backendName() << "does not support DTLS cookies";
}